

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkCleanupNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  void *Entry_00;
  Vec_Ptr_t *vNodes;
  int iVar2;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    p = Vec_PtrAlloc(1000);
    for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
      Entry = Abc_NtkCo(pNtk,iVar2);
      Vec_PtrPush(p,Entry);
    }
    for (iVar2 = 0; iVar2 < vRoots->nSize; iVar2 = iVar2 + 1) {
      Entry_00 = Vec_PtrEntry(vRoots,iVar2);
      if (Entry_00 != (void *)0x0) {
        Vec_PtrPush(p,Entry_00);
      }
    }
    vNodes = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)p->pArray,p->nSize);
    Vec_PtrFree(p);
    uVar1 = Abc_NtkReduceNodes(pNtk,vNodes);
    if (fVerbose != 0) {
      printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar1);
    }
    Vec_PtrFree(vNodes);
    return uVar1;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                ,0x1fc,"int Abc_NtkCleanupNodes(Abc_Ntk_t *, Vec_Ptr_t *, int)");
}

Assistant:

int Abc_NtkCleanupNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vStarts;
    Abc_Obj_t * pObj;
    int i, Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // collect starting nodes into one array
    vStarts = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vStarts, pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( pObj )
            Vec_PtrPush( vStarts, pObj );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vStarts), Vec_PtrSize(vStarts) );
    Vec_PtrFree( vStarts );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}